

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

uint nullcGetTypeSize(uint typeID)

{
  ExternTypeInfo *pEVar1;
  
  if (NULLCTypeInfo::linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(NULLCTypeInfo::linker + 0x200),
                        typeID);
    return pEVar1->size;
  }
  __assert_fail("NULLCTypeInfo::linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x1d5,"unsigned int nullcGetTypeSize(unsigned int)");
}

Assistant:

unsigned int	nullcGetTypeSize(unsigned int typeID)
{
	assert(NULLCTypeInfo::linker);
	return NULLCTypeInfo::linker->exTypes[typeID].size;
}